

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_internal_validate(roaring_bitmap_t *r,char **reason)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  ushort *puVar4;
  _Bool _Var5;
  char *pcVar6;
  long lVar7;
  char **reason_00;
  bool bVar8;
  long lVar9;
  ushort uVar10;
  char *reason_local;
  char *local_28;
  
  reason_00 = &local_28;
  if (reason != (char **)0x0) {
    reason_00 = reason;
  }
  *reason_00 = (char *)0x0;
  iVar2 = (r->high_low_container).size;
  if ((long)iVar2 < 0) {
    bVar8 = false;
    pcVar6 = "negative size";
  }
  else {
    iVar3 = (r->high_low_container).allocation_size;
    if (iVar3 < 0) {
      pcVar6 = "negative allocation size";
    }
    else if (iVar3 < iVar2) {
      pcVar6 = "more containers than allocated space";
    }
    else if ((r->high_low_container).flags < 4) {
      if (iVar2 == 0) {
        return true;
      }
      puVar4 = (r->high_low_container).keys;
      if (puVar4 == (ushort *)0x0) {
        pcVar6 = "keys is NULL";
      }
      else if ((r->high_low_container).typecodes == (uint8_t *)0x0) {
        pcVar6 = "typecodes is NULL";
      }
      else {
        if ((r->high_low_container).containers != (void **)0x0) {
          if (1 < iVar2) {
            lVar9 = 1;
            pcVar6 = "keys not strictly increasing";
            uVar10 = *puVar4;
            do {
              puVar1 = puVar4 + lVar9;
              if (*puVar1 <= uVar10) goto LAB_00119de7;
              lVar9 = lVar9 + 1;
              uVar10 = *puVar1;
            } while (iVar2 != lVar9);
          }
          iVar2 = (r->high_low_container).size;
          bVar8 = iVar2 < 1;
          if (iVar2 < 1) {
            return bVar8;
          }
          _Var5 = container_internal_validate
                            (*(r->high_low_container).containers,*(r->high_low_container).typecodes,
                             reason_00);
          if (_Var5) {
            lVar9 = 1;
            do {
              lVar7 = (long)(r->high_low_container).size;
              bVar8 = lVar7 <= lVar9;
              if (lVar7 <= lVar9) {
                return bVar8;
              }
              _Var5 = container_internal_validate
                                ((r->high_low_container).containers[lVar9],
                                 (r->high_low_container).typecodes[lVar9],reason_00);
              lVar9 = lVar9 + 1;
            } while (_Var5);
          }
          if (*reason_00 != (char *)0x0) {
            return bVar8;
          }
          pcVar6 = "container failed to validate but no reason given";
          goto LAB_00119de9;
        }
        pcVar6 = "containers is NULL";
      }
    }
    else {
      pcVar6 = "invalid flags";
    }
LAB_00119de7:
    bVar8 = false;
  }
LAB_00119de9:
  *reason_00 = pcVar6;
  return bVar8;
}

Assistant:

bool roaring_bitmap_internal_validate(const roaring_bitmap_t *r,
                                      const char **reason) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    const roaring_array_t *ra = &r->high_low_container;
    if (ra->size < 0) {
        *reason = "negative size";
        return false;
    }
    if (ra->allocation_size < 0) {
        *reason = "negative allocation size";
        return false;
    }
    if (ra->size > ra->allocation_size) {
        *reason = "more containers than allocated space";
        return false;
    }
    if (ra->flags & ~(ROARING_FLAG_COW | ROARING_FLAG_FROZEN)) {
        *reason = "invalid flags";
        return false;
    }
    if (ra->size == 0) {
        return true;
    }

    if (ra->keys == NULL) {
        *reason = "keys is NULL";
        return false;
    }
    if (ra->typecodes == NULL) {
        *reason = "typecodes is NULL";
        return false;
    }
    if (ra->containers == NULL) {
        *reason = "containers is NULL";
        return false;
    }

    uint32_t prev_key = ra->keys[0];
    for (int32_t i = 1; i < ra->size; ++i) {
        if (ra->keys[i] <= prev_key) {
            *reason = "keys not strictly increasing";
            return false;
        }
        prev_key = ra->keys[i];
    }

    for (int32_t i = 0; i < ra->size; ++i) {
        if (!container_internal_validate(ra->containers[i], ra->typecodes[i],
                                         reason)) {
            // reason should already be set
            if (*reason == NULL) {
                *reason = "container failed to validate but no reason given";
            }
            return false;
        }
    }

    return true;
}